

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

int __thiscall ON_Xform::Compare(ON_Xform *this,ON_Xform *rhs)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int unaff_10000022;
  int iVar4;
  ulong uVar5;
  double *b;
  double *a;
  int in_R9D;
  
  uVar5 = 0;
  do {
    if (0x7f < uVar5) {
      return 0;
    }
    dVar1 = *(double *)((long)this->m_xform[0] + uVar5);
    dVar2 = *(double *)((long)rhs->m_xform[0] + uVar5);
    iVar4 = -1;
    if (dVar1 < dVar2) {
LAB_006878a5:
      bVar3 = false;
      in_R9D = iVar4;
    }
    else {
      if (dVar2 < dVar1) {
        iVar4 = 1;
        goto LAB_006878a5;
      }
      bVar3 = true;
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        if (!NAN(dVar1)) goto LAB_006878a5;
        bVar3 = NAN(dVar2);
        in_R9D = unaff_10000022;
        if (!bVar3) {
          in_R9D = 1;
        }
      }
    }
    uVar5 = uVar5 + 8;
    unaff_10000022 = in_R9D;
    if (!bVar3) {
      return in_R9D;
    }
  } while( true );
}

Assistant:

int ON_Xform::Compare( const ON_Xform& rhs ) const
{
  const double* a = &m_xform[0][0];
  const double* b = &rhs.m_xform[0][0];
  const double* a16 = a + 16;
  while ( a < a16 )
  {
    const double x = *a++;
    const double y = *b++;
    if ( x < y )
      return -1;
    if ( x > y )
      return 1;
    if (x == y)
      continue;

    if (!(x == x))
    {
      // x is a nan
      if (!(y == y))
        continue; // x and y are nans
      return 1; // x is a nan and y is not.
    }

    // y is a nan and x is not a nan.
    return -1;
  }
  return 0;
}